

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O2

string * HeadingText_abi_cxx11_(string *__return_storage_ptr__,double h)

{
  long lVar1;
  allocator<char> *__a;
  char *__s;
  double dVar2;
  double dVar3;
  allocator<char> local_a;
  allocator<char> local_9;
  
  dVar2 = HeadingNormalize(h);
  dVar3 = 0.0;
  lVar1 = 0;
  do {
    if (lVar1 == 0x80) {
      __s = "N";
      __a = &local_a;
LAB_00121ae8:
      std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
      return __return_storage_ptr__;
    }
    if (dVar2 <= dVar3 + 11.25) {
      __s = *(char **)(&DAT_002bab20 + lVar1);
      __a = &local_9;
      goto LAB_00121ae8;
    }
    dVar3 = dVar3 + 22.5;
    lVar1 = lVar1 + 8;
  } while( true );
}

Assistant:

std::string HeadingText (double h)
{
    constexpr double CARDINAL_HALF_SEGMENT = 360.0 / 16.0 / 2.0;
    h = HeadingNormalize(h);
    double card = 0.0;
    for (const char* sCard: { "N", "NNE", "NE", "ENE",
                              "E", "ESE", "SE", "SSE",
                              "S", "SSW", "SW", "WSW",
                              "W", "WNW", "NW", "NNW" })
    {
        if (h <= card + CARDINAL_HALF_SEGMENT)
            return sCard;
        card += CARDINAL_HALF_SEGMENT * 2.0;
    }
    return "N";
}